

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O3

void __thiscall Node::VariableScanOne(Node *this,int InDefineFlag)

{
  size_type sVar1;
  pointer pcVar2;
  VARTYPE VVar3;
  int iVar4;
  long lVar5;
  Node *pNVar6;
  VariableStruct *pVVar7;
  VARCLASS ThisClass;
  _Alloc_hider _Var8;
  Node *pNVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  VariableStruct local_1c8;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  do {
    iVar4 = this->Type;
    if (iVar4 < 0x1f8) {
      if (iVar4 < 0x1a1) {
        if (0x14a < iVar4) {
          if (iVar4 < 0x161) {
            if (iVar4 != 0x14b) goto switchD_00108e8f_caseD_1fa;
            GosubFlag = 1;
            lVar5 = 0x28;
            goto LAB_00108f85;
          }
          if (0x182 < iVar4) {
            if (iVar4 == 0x183) {
              return;
            }
            if (iVar4 == 0x18d) {
              if (this->Tree[0] != (Node *)0x0) {
                VariableScanOne(this->Tree[0],InDefineFlag);
              }
              OnErrorFlag = 1;
              WhenErrorFlag = 1;
              return;
            }
            if (iVar4 == 399) {
              GosubFlag = 1;
              return;
            }
            goto switchD_00108e8f_caseD_1fa;
          }
          if (iVar4 == 0x161) {
LAB_00109270:
            ScanMap(this);
            return;
          }
          if (iVar4 != 0x163) goto switchD_00108e8f_caseD_1fa;
          pNVar9 = this->Tree[0];
          pNVar6 = (Node *)operator_new(0x70);
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"");
          Node(pNVar6,0x203,&local_1e8,0,0);
          Link(pNVar9,pNVar6,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          VariableScan(this->Tree[0],InDefineFlag);
          pNVar9 = this->Tree[1];
          iVar4 = pNVar9->Type;
          if (iVar4 < 0x2d) {
            if (1 < iVar4 - 0x2aU) {
              if (iVar4 != 0x28) {
                return;
              }
              pNVar9 = pNVar9->Tree[1];
              pNVar6 = (Node *)operator_new(0x70);
              local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
              Node(pNVar6,0x203,&local_268,0,0);
              Link(pNVar9,pNVar6,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._M_dataplus._M_p != &local_268.field_2) {
                operator_delete(local_268._M_dataplus._M_p,
                                local_268.field_2._M_allocated_capacity + 1);
              }
              VariableScan(this->Tree[1]->Tree[0],InDefineFlag);
              pNVar9 = this->Tree[1]->Tree[1];
              goto LAB_00109ac5;
            }
LAB_0010984e:
            pNVar9 = pNVar9->Tree[0];
            pNVar6 = (Node *)operator_new(0x70);
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"");
            Node(pNVar6,0x203,&local_228,0,0);
            Link(pNVar9,pNVar6,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            pNVar9 = this->Tree[1]->Tree[1];
            pNVar6 = (Node *)operator_new(0x70);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
            Node(pNVar6,0x203,&local_248,0,0);
            Link(pNVar9,pNVar6,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
            local_208.field_2._M_allocated_capacity = local_248.field_2._M_allocated_capacity;
            _Var8._M_p = local_248._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
LAB_0010993a:
              operator_delete(_Var8._M_p,local_208.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            if (iVar4 == 0x2d) goto LAB_0010984e;
            if ((iVar4 != 0x154) && (iVar4 != 0x1a8)) {
              return;
            }
            pNVar9 = pNVar9->Tree[0];
            pNVar6 = (Node *)operator_new(0x70);
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"");
            Node(pNVar6,0x203,&local_208,0,0);
            Link(pNVar9,pNVar6,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
            _Var8._M_p = local_208._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) goto LAB_0010993a;
          }
          pNVar9 = this->Tree[1];
          goto LAB_00109ac5;
        }
        if (iVar4 < 0x122) {
          if (iVar4 < 0x115) {
            if (iVar4 == 0x2b) {
              VariableScanOne(this->Tree[0],InDefineFlag);
              VariableScanOne(this->Tree[1],InDefineFlag);
              iVar4 = IsReallyString(this->Tree[0]);
              if (iVar4 == 0) {
                return;
              }
              iVar4 = IsReallyString(this->Tree[1]);
              if (iVar4 == 0) {
                return;
              }
              std::operator+(&local_1c8.BasicName,&this->Tree[0]->TextValue,
                             &this->Tree[1]->TextValue);
              this->Type = 0x1d4;
              pNVar9 = this->Tree[0];
              if (pNVar9 != (Node *)0x0) {
                ~Node(pNVar9);
              }
              operator_delete(pNVar9,0x70);
              this->Tree[0] = (Node *)0x0;
              pNVar9 = this->Tree[1];
              if (pNVar9 != (Node *)0x0) {
                ~Node(pNVar9);
              }
              operator_delete(pNVar9,0x70);
              this->Tree[1] = (Node *)0x0;
              std::__cxx11::string::_M_assign((string *)&this->TextValue);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8.BasicName._M_dataplus._M_p == &local_1c8.BasicName.field_2) {
                return;
              }
              operator_delete(local_1c8.BasicName._M_dataplus._M_p,
                              local_1c8.BasicName.field_2._M_allocated_capacity + 1);
              return;
            }
            if (iVar4 != 0x111) goto switchD_00108e8f_caseD_1fa;
            pNVar9 = this->Tree[0];
            VVar3 = VARTYPE_VOID;
            ThisClass = VARCLASS_FUNC;
            iVar4 = 0;
            goto LAB_001090d9;
          }
          if (iVar4 != 0x115) {
            if (iVar4 == 0x11b) goto LAB_00109270;
            goto switchD_00108e8f_caseD_1fa;
          }
          if ((this->Tree[1]->Type == 0x1d3) &&
             ((pVVar7 = VariableList::Lookup(Variables,&this->Tree[1]->TextValue,(Node *)0x0,0),
              pVVar7 == (VariableStruct *)0x0 || (pVVar7->Type != VARTYPE_DYNSTR)))) {
            pcVar2 = (this->Tree[0]->TextValue)._M_dataplus._M_p;
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,pcVar2,
                       pcVar2 + (this->Tree[0]->TextValue)._M_string_length);
            VVar3 = GuessVarType(&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            if (VVar3 == VARTYPE_DYNSTR) goto LAB_001094a5;
            this->Type = 0x116;
            pNVar9 = this->Tree[1];
            pNVar6 = (Node *)operator_new(0x70);
            paVar10 = &local_130.field_2;
            local_130._M_dataplus._M_p = (pointer)paVar10;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
            Node(pNVar6,0x203,&local_130,0,0);
            Link(pNVar9,pNVar6,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
            _Var8._M_p = local_130._M_dataplus._M_p;
          }
          else {
LAB_001094a5:
            this->Type = 0x117;
            pNVar9 = this->Tree[0];
            pNVar6 = (Node *)operator_new(0x70);
            paVar10 = &local_110.field_2;
            local_110._M_dataplus._M_p = (pointer)paVar10;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
            Node(pNVar6,0x203,&local_110,0,0);
            Link(pNVar9,pNVar6,(Node *)0x0,(Node *)0x0,(Node *)0x0,(Node *)0x0);
            _Var8._M_p = local_110._M_dataplus._M_p;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var8._M_p != paVar10) {
            operator_delete(_Var8._M_p,paVar10->_M_allocated_capacity + 1);
          }
          VariableScan(this->Tree[0],InDefineFlag);
          pNVar9 = this->Tree[1];
          goto LAB_00109ac5;
        }
        if (iVar4 < 0x137) {
          switch(iVar4) {
          case 0x122:
          case 0x125:
          case 0x126:
            goto switchD_00108ec0_caseD_1ce;
          default:
            goto switchD_00108e8f_caseD_1fa;
          case 299:
            if (this->Tree[1] != (Node *)0x0) {
              VariableScanOne(this->Tree[1],1);
            }
          case 0x124:
switchD_00108e8f_caseD_1ff:
            pNVar9 = this->Tree[0];
            ThisClass = VARCLASS_NONE;
            goto LAB_001090d4;
          }
        }
        if (iVar4 == 0x137) goto switchD_00108e8f_caseD_1ff;
        if (iVar4 == 0x143) goto LAB_00109290;
        if (iVar4 != 0x144) goto switchD_00108e8f_caseD_1fa;
        if (this->Tree[0] == (Node *)0x0) {
          VVar3 = VARTYPE_VOID;
        }
        else {
          VVar3 = ScanType(this->Tree[0]);
        }
        pVVar7 = VariableList::Lookup(Variables,&this->Tree[2]->TextValue,this,0);
        if (pVVar7 == (VariableStruct *)0x0) {
          pcVar2 = (this->Tree[2]->TextValue)._M_dataplus._M_p;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar2,pcVar2 + (this->Tree[2]->TextValue)._M_string_length
                    );
          VariableStruct::VariableStruct(&local_1c8,&local_90,VVar3,VARCLASS_FUNC,InDefineFlag,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          VariableList::Append(Variables,&local_1c8,1);
          VariableStruct::~VariableStruct(&local_1c8);
        }
        else {
          pVVar7->Class = VARCLASS_FUNC;
          pVVar7->Type = VVar3;
        }
        pNVar9 = this->Tree[2]->Tree[0];
        goto LAB_00109abb;
      }
      switch(iVar4) {
      case 0x1cd:
        pVVar7 = VariableList::Lookup(Variables,&this->TextValue,this,0);
        if (pVVar7 == (VariableStruct *)0x0) {
          pcVar2 = (this->TextValue)._M_dataplus._M_p;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar2,pcVar2 + (this->TextValue)._M_string_length);
          VariableStruct::VariableStruct
                    (&local_1c8,&local_50,VARTYPE_VOID,VARCLASS_FUNC,InDefineFlag,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          VariableList::Append(Variables,&local_1c8,1);
          VariableStruct::~VariableStruct(&local_1c8);
        }
        else {
          pVVar7->Class = VARCLASS_FUNC;
        }
        if (this->Tree[0] != (Node *)0x0) {
          VariableScan(this->Tree[0],InDefineFlag);
        }
        break;
      case 0x1ce:
      case 0x1cf:
      case 0x1d0:
        goto switchD_00108ec0_caseD_1ce;
      case 0x1d1:
        sVar1 = (this->TextValue)._M_string_length;
        if ((this->TextValue)._M_dataplus._M_p[sVar1 - 1] == ':') {
          std::__cxx11::string::_M_erase((ulong)&this->TextValue,sVar1 - 1);
        }
        pVVar7 = VariableList::Lookup(Variables,&this->TextValue,(Node *)0x0,0);
        if (pVVar7 != (VariableStruct *)0x0) {
          return;
        }
        pcVar2 = (this->TextValue)._M_dataplus._M_p;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar2,pcVar2 + (this->TextValue)._M_string_length);
        VariableStruct::VariableStruct(&local_1c8,&local_b0,VARTYPE_LABEL,VARCLASS_LABEL,1,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        VariableList::Append(Variables,&local_1c8,0);
        goto LAB_00109b5b;
      case 0x1d2:
        pVVar7 = VariableList::Lookup(Variables,&this->TextValue,(Node *)0x0,0);
        if (pVVar7 != (VariableStruct *)0x0) {
          pVVar7->EverUsed = pVVar7->EverUsed + 1;
          return;
        }
        pcVar2 = (this->TextValue)._M_dataplus._M_p;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,pcVar2,pcVar2 + (this->TextValue)._M_string_length);
        VariableStruct::VariableStruct(&local_1c8,&local_d0,VARTYPE_LABEL,VARCLASS_LABEL,1,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        local_1c8.EverUsed = local_1c8.EverUsed + 1;
        VariableList::Append(Variables,&local_1c8,0);
LAB_00109b5b:
        VariableStruct::~VariableStruct(&local_1c8);
        return;
      case 0x1d3:
        VariableList::Define(Variables,this,0,InDefineFlag);
        if (this->Tree[0] != (Node *)0x0) {
          VariableScanOne(this->Tree[0],InDefineFlag);
        }
        this = this->Tree[2];
        goto joined_r0x00108f12;
      case 0x1d4:
      case 0x1d5:
      case 0x1d6:
      case 0x1d7:
      case 0x1d8:
      case 0x1d9:
        goto switchD_00108e8f_caseD_1fa;
      case 0x1da:
        goto switchD_00108e8f_caseD_1ff;
      case 0x1db:
        goto switchD_00108e8f_caseD_1fd;
      default:
        if (iVar4 == 0x1ef) goto LAB_00108f73;
        if (iVar4 != 0x1a1) goto switchD_00108e8f_caseD_1fa;
LAB_00109290:
        if (this->Tree[0] == (Node *)0x0) {
          VVar3 = VARTYPE_VOID;
        }
        else {
          VVar3 = ScanType(this->Tree[0]);
        }
        pVVar7 = VariableList::Lookup(Variables,&this->Tree[1]->TextValue,this,0);
        if (pVVar7 == (VariableStruct *)0x0) {
          pcVar2 = (this->Tree[1]->TextValue)._M_dataplus._M_p;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar2,pcVar2 + (this->Tree[1]->TextValue)._M_string_length
                    );
          VariableStruct::VariableStruct(&local_1c8,&local_70,VVar3,VARCLASS_FUNC,InDefineFlag,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          VariableList::Append(Variables,&local_1c8,1);
          if (local_1c8.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1c8.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1c8.ParList.
                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_1c8.ParList.
                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8.Prefix._M_dataplus._M_p != &local_1c8.Prefix.field_2) {
            operator_delete(local_1c8.Prefix._M_dataplus._M_p,
                            local_1c8.Prefix.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8.CName._M_dataplus._M_p != &local_1c8.CName.field_2) {
            operator_delete(local_1c8.CName._M_dataplus._M_p,
                            local_1c8.CName.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8.BasicName._M_dataplus._M_p != &local_1c8.BasicName.field_2) {
            operator_delete(local_1c8.BasicName._M_dataplus._M_p,
                            local_1c8.BasicName.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          pVVar7->Class = VARCLASS_FUNC;
          pVVar7->Type = VVar3;
        }
      }
      pNVar9 = this->Tree[3];
LAB_00109abb:
      if (pNVar9 == (Node *)0x0) {
        return;
      }
      InDefineFlag = 1;
LAB_00109ac5:
      VariableScan(pNVar9,InDefineFlag);
      return;
    }
    switch(iVar4) {
    case 0x1f8:
      GosubFlag = 1;
LAB_00108f73:
      VariableScanOne(this->Tree[0],InDefineFlag);
      lVar5 = 0x30;
LAB_00108f85:
      this = *(Node **)((long)this->Tree + lVar5 + -0x28);
      break;
    case 0x1f9:
      OnErrorFlag = 1;
LAB_00108f96:
      this = this->Tree[0];
      goto joined_r0x00108f12;
    case 0x1fa:
    case 0x1fb:
    case 0x1fc:
switchD_00108e8f_caseD_1fa:
      if (this->Tree[0] != (Node *)0x0) {
        VariableScan(this->Tree[0],InDefineFlag);
      }
      if (this->Tree[1] != (Node *)0x0) {
        VariableScan(this->Tree[1],InDefineFlag);
      }
      if (this->Tree[2] != (Node *)0x0) {
        VariableScan(this->Tree[2],InDefineFlag);
      }
      if (this->Tree[3] != (Node *)0x0) {
        VariableScan(this->Tree[3],InDefineFlag);
      }
      if (this->Tree[4] != (Node *)0x0) {
        VariableScan(this->Tree[4],InDefineFlag);
      }
      if (this->Block[1] != (Node *)0x0) {
        VariableScan(this->Block[1],InDefineFlag);
      }
      if (this->Block[2] == (Node *)0x0) {
        return;
      }
      VariableScan(this->Block[2],InDefineFlag);
      return;
    case 0x1fd:
    case 0x1fe:
switchD_00108e8f_caseD_1fd:
      pNVar9 = this->Tree[0];
      ThisClass = VARCLASS_FUNC;
LAB_001090d4:
      VVar3 = VARTYPE_REAL;
      iVar4 = 1;
LAB_001090d9:
      ScanVarList(pNVar9,VVar3,ThisClass,iVar4);
      return;
    case 0x1ff:
      goto switchD_00108e8f_caseD_1ff;
    default:
      if (iVar4 != 0x207) {
        if (iVar4 != 0x209) goto switchD_00108e8f_caseD_1fa;
        WhenErrorFlag = 1;
        goto LAB_00108f96;
      }
      LowerCase(&this->TextValue);
      if (this->Tree[0] != (Node *)0x0) {
        VariableScanOne(this->Tree[0],InDefineFlag);
      }
      this = this->Tree[2];
joined_r0x00108f12:
      if (this == (Node *)0x0) {
switchD_00108ec0_caseD_1ce:
        return;
      }
    }
  } while( true );
}

Assistant:

void Node::VariableScanOne(
	int InDefineFlag	/**< Are we in a define statement */
)
{
	VariableStruct *ThisVar;
	VARTYPE ThisType = VARTYPE_NONE;

	//
	// Look at current node type
	//
	switch (Type)
	{
	case BAS_N_EXTERNALCONSTANT:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_NONE, true);
		break;

	case BAS_N_EXTERNALSUB:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_FUNC, true);
		break;

	case BAS_S_CALL:
		Tree[0]->ScanVarList(VARTYPE_VOID, VARCLASS_FUNC, false);
		break;

	case BAS_S_COMMON:
		ScanMap();
		break;

	case BAS_S_DATA:
		break;

	case BAS_S_DECLARE:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_NONE, true);
		break;

	case BAS_V_DECLARECONSTANT:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_NONE, true);
		break;

	case BAS_V_DECLAREFUN:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_FUNC, true);
		break;

	case BAS_S_DIM:
		if (Tree[1] != 0)
		{
			Tree[1]->VariableScanOne(1);
		}
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_NONE, true);
		break;

	case BAS_S_EXTERNAL:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_NONE, true);
		break;

	case BAS_S_MAP:
		ScanMap();
		break;

	case BAS_V_FUNCTION:
		//
		// Built in function
		//
		ThisVar = Variables->Lookup(TextValue, this);
		if (ThisVar == 0)
		{
			//
			// Create variable
			//
			VariableStruct NewVar(TextValue,
				VARTYPE_VOID, VARCLASS_FUNC, InDefineFlag);

			//
			// Add to variable table
			//
			Variables->Append(NewVar, true);	// Forced global
		}
		else
		{
			ThisVar->Class = VARCLASS_FUNC;
		}
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScan(InDefineFlag);
		}
		if (Tree[3] != 0)
		{
			Tree[3]->VariableScan(1);
		}
		break;

	case BAS_N_EXTERNALFUNCTION:
		Tree[0]->ScanVarList(VARTYPE_REAL, VARCLASS_FUNC, true);
		break;

	case BAS_S_DEF:
	case BAS_S_DEFSTAR:
		break;

	case BAS_S_FUNCTION:
	case BAS_S_SUB:

		//
		// Function Definition
		//   0 = Return type
		//   1 - Function name
		//   2 -
		//   3 - Calling Parameters
		//
		// must have a name
		//
		//
		// Functions return type
		//
		if (Tree[0] != 0)
		{
			ThisType = Tree[0]->ScanType();
		}
		else
		{
			ThisType = VARTYPE_VOID;
		}

		//
		// This functions name
		//
		ThisVar = Variables->Lookup(Tree[1]->TextValue, this);
		if (ThisVar == 0)
		{
			//
			// Create variable
			//
			VariableStruct NewVar(Tree[1]->TextValue,
				ThisType, VARCLASS_FUNC, InDefineFlag);

			//
			// Add to variable table
			//
			Variables->Append(NewVar, true);	// Forced global
		}
		else
		{
			ThisVar->Class =VARCLASS_FUNC;
			ThisVar->Type = ThisType;
		}

		//
		// Scan calling parameters
		//
		if (Tree[3] != 0)
		{
			Tree[3]->VariableScan(1);
		}

		break;

	case BAS_S_MAINFUNCTION:
		//
		// Function Definition
		//
		if (Tree[0] != 0)
		{
			ThisType = Tree[0]->ScanType();
		}
		else
		{
			ThisType = VARTYPE_VOID;
		}

		ThisVar = Variables->Lookup(Tree[2]->TextValue, this);
		if (ThisVar == 0)
		{
			//
			// Create variable
			//
			VariableStruct NewVar(Tree[2]->TextValue,
				ThisType, VARCLASS_FUNC, InDefineFlag);

			//
			// Add to variable table
			//
			Variables->Append(NewVar, 1);		// Forced global
		}
		else
		{
			ThisVar->Class = VARCLASS_FUNC;
			ThisVar->Type = ThisType;
		}

		//
		// Scan calling parameters
		//
		if (Tree[2]->Tree[0] != 0)
		{
			Tree[2]->Tree[0]->VariableScan(1);
		}

		break;

	case BAS_V_LABEL:
		if (*(TextValue.end() - 1) == ':')
		{
#ifdef STLREMOVE
			TextValue.remove(TextValue.end() - 1);
#else
			TextValue.erase(TextValue.end() - 1);
#endif
		}
		ThisVar = Variables->Lookup(TextValue, 0);
		if (ThisVar == 0)
		{
			VariableStruct NewVar(TextValue,
				VARTYPE_LABEL, VARCLASS_LABEL, true);
			Variables->Append(NewVar);
		}
		break;

	case BAS_V_USELABEL:
		ThisVar = Variables->Lookup(TextValue, 0);
		if (ThisVar == 0)
		{
			VariableStruct NewVar(TextValue,
				VARTYPE_LABEL, VARCLASS_LABEL, true);
			NewVar.EverUsed++;
			Variables->Append(NewVar);
		}
		else
		{
			ThisVar->EverUsed++;
		}
		break;

	case BAS_V_NAME:
		Variables->Define(this, false, InDefineFlag);

		//
		// Look at possible array reference
		//
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScanOne(InDefineFlag);
		}

		if (Tree[2] != 0)
		{
			Tree[2]->VariableScanOne(InDefineFlag);
		}

		break;

	case BAS_S_RECORD:
//
// FIXME:
// We don't scan the structure names because they are not real
// (ie. expposed to the outside world).
// We should probibly create some kind of definition list for structure
// definitions.
//
//		Tree[0]->VariableScanOne(1);
		break;

	case BAS_N_STRUCTNAME:

		//
		// Force structure variable to be usable under C++
		//
		LowerCase(TextValue);

		//
		// Look at possible array reference
		//
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScanOne(InDefineFlag);
		}

		if (Tree[2] != 0)
		{
			Tree[2]->VariableScanOne(InDefineFlag);
		}

		break;

	case BAS_X_STRREF:

		Tree[0]->VariableScanOne(InDefineFlag);
		Tree[1]->VariableScanOne(InDefineFlag);

		break;

	case BAS_S_GOSUB:
		GosubFlag = 1;
		Tree[0]->VariableScanOne(InDefineFlag);
		break;

	case BAS_N_ONERROR:
		OnErrorFlag = 1;
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScanOne(InDefineFlag);
		}
		break;

	case BAS_N_WHENERRORIN:
		WhenErrorFlag = 1;
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScanOne(InDefineFlag);
		}
		break;

	case BAS_N_ONGOSUB:
		GosubFlag = 1;
		Tree[0]->VariableScanOne(InDefineFlag);
		Tree[1]->VariableScanOne(InDefineFlag);
		break;

	case BAS_S_RETURN:
		GosubFlag = 1;
		break;

	case BAS_S_RESUME:
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScanOne(InDefineFlag);
		}
		OnErrorFlag = 1;
		WhenErrorFlag = 1;
		break;

	case '+':
		//
		// Process lower levels first
		//
		Tree[0]->VariableScanOne(InDefineFlag);
		Tree[1]->VariableScanOne(InDefineFlag);

		//
		// Let's try and merge text strings together
		//
		if (Tree[0]->IsReallyString() && Tree[1]->IsReallyString())
		{
			//
			// Create merged string (Using the colon
			// concatination options)
			//
			std::string Merger = Tree[0]->TextValue + Tree[1]->TextValue;

			//
			// Change the root node to the concatinated string
			// type.
			//
			Type = BAS_V_TEXTSTRING;
			delete Tree[0];
			Tree[0] = 0;
			delete Tree[1];
			Tree[1] = 0;
			TextValue = Merger;
		}
		break;

	case BAS_S_CHANGE:
		//
		// This is a strange statement, and we need to determine
		// which one is a string and which one is a numeric
		// array.
		//
		{
			//
			// Assume 2nd one is a string
			//
			VARTYPE Type1 = VARTYPE_DYNSTR;
			if (Tree[1]->Type != BAS_V_NAME)
			{
				//
				// If it isn't a variable name, it better be
				// a string. (You can't add arrays)
				//
				Type1 = VARTYPE_DYNSTR;
			}
			else
			{
				//
				// Does it already have a defined type?
				//
				ThisVar = Variables->Lookup(Tree[1]->TextValue, 0);
				if ((ThisVar != 0) &&
					(ThisVar->Type == VARTYPE_DYNSTR))
				{
					Type1 = ThisVar->Type;
				}
				else
				{
					Type1 = GuessVarType(Tree[0]->TextValue);
				}
			}
			//
			// Ok, now force one of them to be an array
			//
			if (Type1 == VARTYPE_DYNSTR)
			{
				// change a% to b$
				Type = BAS_S_CHANGE2;
				Tree[0]->Link(new Node(BAS_N_NULL));
			}
			else
			{
				// change a$ to b%
				Type = BAS_S_CHANGE1;
				Tree[1]->Link(new Node(BAS_N_NULL));
			}
		}
		Tree[0]->VariableScan(InDefineFlag);
		Tree[1]->VariableScan(InDefineFlag);
		break;

	case BAS_S_MAT:
		//
		// Force array type to l-value
		//
		Tree[0]->Link(new Node(BAS_N_NULL));
		Tree[0]->VariableScan(InDefineFlag);

		switch(Tree[1]->Type)
		{
		case BAS_S_CON:		// MAT xxx = ZER
		case BAS_S_IDN:
		case BAS_S_ZER:
			break;

		case BAS_S_TRN:		// MAT xxx = TRN(yyy)
		case BAS_S_INV:
			//
			// rvalue MUST be array
			//
			Tree[1]->Tree[0]->Link(new Node(BAS_N_NULL));
			Tree[1]->VariableScan(InDefineFlag);
			break;

		case '+':			// MAT xxx = yyy + zzz
		case '-':
		case '*':
			//
			// Two rvalues MUST be arrays
			//
			Tree[1]->Tree[0]->Link(new Node(BAS_N_NULL));
			Tree[1]->Tree[1]->Link(new Node(BAS_N_NULL));
			Tree[1]->VariableScan(InDefineFlag);
			break;

		case '(':			// MAT xxx = (yyy) * zzz
			//
			// right rvalue values MUST be arrays
			//
			Tree[1]->Tree[1]->Link(new Node(BAS_N_NULL));
			Tree[1]->Tree[0]->VariableScan(InDefineFlag);
			Tree[1]->Tree[1]->VariableScan(InDefineFlag);
			break;

		default:			// Oops, forgot to code something
			break;
		}

		break;

	case BAS_V_INTEGER:
	case BAS_V_FLOAT:
	case BAS_V_INT:
		// Ignore various numeric constants
		break;

	default:
		if (Tree[0] != 0)
		{
			Tree[0]->VariableScan(InDefineFlag);
		}

		if (Tree[1] != 0)
		{
			Tree[1]->VariableScan(InDefineFlag);
		}

		if (Tree[2] != 0)
		{
			Tree[2]->VariableScan(InDefineFlag);
		}

		if (Tree[3] != 0)
		{
			Tree[3]->VariableScan(InDefineFlag);
		}

		if (Tree[4] != 0)
		{
			Tree[4]->VariableScan(InDefineFlag);
		}

		if (Block[1] != 0)
		{
			Block[1]->VariableScan(InDefineFlag);
		}

		if (Block[2] != 0)
		{
			Block[2]->VariableScan(InDefineFlag);
		}
		break;
	}
}